

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O0

void digactualhole(int x,int y,monst *madeby,int ttyp)

{
  obj *poVar1;
  obj *poVar2;
  level *plVar3;
  xchar y_00;
  boolean bVar4;
  byte bVar5;
  schar sVar6;
  xchar xVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  char *pcVar12;
  bool isyou;
  bool bVar13;
  bool bVar14;
  bool local_17a;
  monst *local_168;
  d_level local_160;
  d_level local_15e;
  int local_15c;
  d_level tolevel;
  d_level newlevel;
  int by;
  int bx;
  boolean wont_fall;
  boolean at_u;
  boolean madeby_obj;
  boolean madeby_u;
  monst *mtmp;
  boolean shopdoor;
  rm *loc;
  char surface_type [256];
  trap *ttmp;
  obj *newobjs;
  obj *oldobjs;
  int ttyp_local;
  monst *madeby_local;
  int y_local;
  int x_local;
  
  plVar3 = level;
  if ((level->monsters[x][y] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
    local_168 = (monst *)0x0;
  }
  else {
    local_168 = level->monsters[x][y];
  }
  isyou = madeby == &youmonst;
  iVar11 = (int)u.ux;
  iVar9 = (int)u.uy;
  bVar13 = true;
  if (((((u.uprops[0x12].intrinsic == 0) && (bVar13 = true, u.uprops[0x12].extrinsic == 0)) &&
       (bVar13 = true, (youmonst.data)->mlet != '\x05')) &&
      ((bVar13 = true, u.uprops[0x3c].extrinsic == 0 &&
       (bVar13 = true, ((youmonst.data)->mflags1 & 1) == 0)))) &&
     (bVar13 = false, u.usteed != (monst *)0x0)) {
    bVar13 = ((u.usteed)->data->mflags1 & 1) != 0;
  }
  if ((u.utrap != 0) && (u.utraptype == 4)) {
    u.utrap = 0;
  }
  xVar7 = (xchar)x;
  y_00 = (xchar)y;
  if (level->locations[x][y].typ == '\x1c') {
    dogushforth(0);
    *(uint *)&level->locations[x][y].field_0x6 =
         *(uint *)&level->locations[x][y].field_0x6 & 0xfffffe0f |
         (*(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x1f | 2) << 4;
    dryup(xVar7,y_00,isyou);
    return;
  }
  if (level->locations[x][y].typ == '\x1f') {
    breaksink(x,y);
    return;
  }
  if ((level->locations[x][y].typ == '$') || (iVar8 = is_drawbridge_wall(x,y), -1 < iVar8)) {
    local_15c = y;
    _tolevel = x;
    find_drawbridge((int *)&tolevel,&local_15c);
    destroy_drawbridge(_tolevel,local_15c);
    return;
  }
  oldobjs._4_4_ = ttyp;
  if ((ttyp != 0xb) && (bVar4 = can_dig_down(level), bVar4 == '\0')) {
    impossible("digactualhole: can\'t dig %s on this level.",trapexplain[ttyp + -1]);
    oldobjs._4_4_ = 0xb;
  }
  if (plVar3->locations[x][y].typ == ' ') {
    strcpy((char *)&loc,"grave");
  }
  else {
    pcVar10 = surface(x,y);
    strcpy((char *)&loc,pcVar10);
  }
  bVar14 = false;
  if (plVar3->locations[x][y].typ == '\x17') {
    pcVar10 = in_rooms(level,xVar7,y_00,0x12);
    bVar14 = *pcVar10 != '\0';
  }
  poVar1 = level->objects[x][y];
  surface_type._248_8_ = maketrap(level,x,y,oldobjs._4_4_);
  if ((trap *)surface_type._248_8_ == (trap *)0x0) {
    return;
  }
  poVar2 = level->objects[x][y];
  local_17a = true;
  if (!isyou) {
    local_17a = (viz_array[y][x] & 2U) != 0;
  }
  ((trap *)surface_type._248_8_)->field_0x8 =
       ((trap *)surface_type._248_8_)->field_0x8 & 0xdf | local_17a << 5;
  ((trap *)surface_type._248_8_)->field_0x8 =
       ((trap *)surface_type._248_8_)->field_0x8 & 0x7f | isyou << 7;
  newsym((int)((trap *)surface_type._248_8_)->tx,(int)((trap *)surface_type._248_8_)->ty);
  if (oldobjs._4_4_ != 0xb) {
    if (isyou) {
      pline("You dig a hole through the %s.");
    }
    else {
      if (madeby != (monst *)0x0) {
        if (madeby->wormno == '\0') {
          if ((viz_array[madeby->my][madeby->mx] & 2U) == 0) {
            if ((((u.uprops[0x1e].intrinsic != 0) ||
                 (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                  (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
               (((u.uprops[0x40].intrinsic == 0 &&
                 ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
                ((madeby->data->mflags3 & 0x200) == 0)))) goto LAB_001835f5;
            bVar5 = viz_array[madeby->my][madeby->mx] & 1;
            goto joined_r0x00183543;
          }
        }
        else {
          bVar5 = worm_known(level,madeby);
joined_r0x00183543:
          if (bVar5 == 0) goto LAB_001835f5;
        }
        if ((((((*(uint *)&madeby->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
           ((((*(uint *)&madeby->field_0x60 >> 7 & 1) == 0 &&
             ((*(uint *)&madeby->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0)))
           ) {
          pcVar10 = Monnam(madeby);
          pline("%s digs a hole through the %s.",pcVar10,&loc);
          goto LAB_00183640;
        }
      }
LAB_001835f5:
      if (((viz_array[y][x] & 2U) != 0) && (flags.verbose != '\0')) {
        pline("A hole appears in the %s.");
      }
    }
LAB_00183640:
    if (x == iVar11 && y == iVar9) {
      if (((u.ustuck == (monst *)0x0) && (!bVar13)) && (bVar4 = next_to_u(), bVar4 == '\0')) {
        pline("You are jerked back by your pet!");
        bVar13 = true;
      }
      if ((u.ustuck == (monst *)0x0) && (!bVar13)) {
        if ((u.ushops[0] == '\0') || (!isyou)) {
          if (!isyou) {
            pay_for_damage("dig into",'\x01');
          }
        }
        else {
          shopdig(1);
        }
        pline("You fall through...");
        local_15e.dnum = u.uz.dnum;
        local_15e.dlevel = u.uz.dlevel + '\x01';
        goto_level(&local_15e,'\0','\x01','\0');
        spoteffects('\0');
        return;
      }
      if (poVar2 != (obj *)0x0) {
        impact_drop((obj *)0x0,xVar7,y_00,'\0');
      }
      if (poVar1 != poVar2) {
        pickup(1);
      }
      if (!bVar14) {
        return;
      }
      if (!isyou) {
        return;
      }
      pay_for_damage("ruin",'\0');
      return;
    }
    if ((bVar14) && (isyou)) {
      pay_for_damage("ruin",'\0');
    }
    if (poVar2 != (obj *)0x0) {
      impact_drop((obj *)0x0,xVar7,y_00,'\0');
    }
    if (local_168 == (monst *)0x0) {
      return;
    }
    if ((local_168->data->mflags1 & 1) != 0) {
      return;
    }
    if (local_168->data->mlet == '\x05') {
      return;
    }
    if (local_168->data == mons + 0x56) {
      return;
    }
    if ((local_168->wormno != '\0') && (iVar9 = count_wsegs(local_168), 5 < iVar9)) {
      return;
    }
    if (3 < local_168->data->msize) {
      return;
    }
    if (local_168 == u.ustuck) {
      return;
    }
    bVar4 = teleport_pet(local_168,'\0');
    if (bVar4 == '\0') {
      return;
    }
    bVar4 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
    if (bVar4 != '\0') {
      assign_level(&local_160,&dungeon_topology.d_valley_level);
LAB_00183b38:
      if ((*(uint *)&local_168->field_0x60 >> 0x19 & 1) != 0) {
        make_angry_shk(local_168,'\0','\0');
      }
      xVar7 = ledger_no(&local_160);
      migrate_to_level(local_168,xVar7,'\0',(coord *)0x0);
      return;
    }
    bVar4 = Is_botlevel(&u.uz);
    if (bVar4 == '\0') {
      sVar6 = depth(&u.uz);
      get_level(&local_160,sVar6 + 1);
      goto LAB_00183b38;
    }
    if (local_168->wormno == '\0') {
      if ((viz_array[local_168->my][local_168->mx] & 2U) != 0) goto LAB_00183a63;
      if ((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
        if (ublindf == (obj *)0x0) {
          return;
        }
        if (ublindf->oartifact != '\x1d') {
          return;
        }
      }
      if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) {
        return;
      }
      if ((local_168->data->mflags3 & 0x200) == 0) {
        return;
      }
      bVar5 = viz_array[local_168->my][local_168->mx] & 1;
    }
    else {
      bVar5 = worm_known(level,local_168);
    }
    if (bVar5 == 0) {
      return;
    }
LAB_00183a63:
    if ((((*(uint *)&local_168->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
       ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
      return;
    }
    if ((*(uint *)&local_168->field_0x60 >> 7 & 1) != 0) {
      return;
    }
    if ((*(uint *)&local_168->field_0x60 >> 9 & 1) != 0) {
      return;
    }
    if (((byte)u._1052_1_ >> 5 & 1) != 0) {
      return;
    }
    pcVar10 = Monnam(local_168);
    pline("%s avoids the trap.",pcVar10);
    return;
  }
  if (isyou) {
    pline("You dig a pit in the %s.");
    if (bVar14) {
      pay_for_damage("ruin",'\0');
    }
  }
  else {
    if (madeby != (monst *)0x0) {
      if (madeby->wormno == '\0') {
        if ((viz_array[madeby->my][madeby->mx] & 2U) == 0) {
          if (((((u.uprops[0x1e].intrinsic != 0) ||
                (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                 (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
               ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
              ((u.uprops[0x40].intrinsic == 0 &&
               ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))))) ||
             ((madeby->data->mflags3 & 0x200) == 0)) goto LAB_00183018;
          bVar5 = viz_array[madeby->my][madeby->mx] & 1;
          goto joined_r0x00182f66;
        }
      }
      else {
        bVar5 = worm_known(level,madeby);
joined_r0x00182f66:
        if (bVar5 == 0) goto LAB_00183018;
      }
      if ((((((*(uint *)&madeby->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         ((((*(uint *)&madeby->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&madeby->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0))))
      {
        pcVar10 = Monnam(madeby);
        pline("%s digs a pit in the %s.",pcVar10,&loc);
        goto LAB_00183063;
      }
    }
LAB_00183018:
    if (((viz_array[y][x] & 2U) != 0) && (flags.verbose != '\0')) {
      pline("A pit appears in the %s.",&loc);
    }
  }
LAB_00183063:
  if (x == iVar11 && y == iVar9) {
    if (bVar13) {
      u.utrap = 0;
    }
    else {
      if (((u.uprops[0x3e].intrinsic == 0) && (u.uprops[0x3e].extrinsic == 0)) &&
         (((youmonst.data)->mflags1 & 8) == 0)) {
        iVar9 = rn2(4);
        u.utrap = iVar9 + 2;
      }
      u.utraptype = 1;
      vision_full_recalc = '\x01';
    }
    if (poVar1 == poVar2) {
      return;
    }
    pickup(1);
    return;
  }
  if (local_168 == (monst *)0x0) {
    return;
  }
  if (((local_168->data->mflags1 & 1) == 0) && (local_168->data->mlet != '\x05')) {
    if (local_168 == madeby) {
      return;
    }
    mintrap(local_168);
    return;
  }
  if (local_168->wormno == '\0') {
    if ((viz_array[local_168->my][local_168->mx] & 2U) != 0) goto LAB_001832ba;
    if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
       (((youmonst.data)->mflags1 & 0x1000) != 0)) {
      if (ublindf == (obj *)0x0) {
        return;
      }
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
       (((youmonst.data)->mflags3 & 0x100) == 0)) {
      return;
    }
    if ((local_168->data->mflags3 & 0x200) == 0) {
      return;
    }
    bVar5 = viz_array[local_168->my][local_168->mx] & 1;
  }
  else {
    bVar5 = worm_known(level,local_168);
  }
  if (bVar5 == 0) {
    return;
  }
LAB_001832ba:
  if ((((((*(uint *)&local_168->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)))) &&
      (((*(uint *)&local_168->field_0x60 >> 7 & 1) == 0 &&
       ((*(uint *)&local_168->field_0x60 >> 9 & 1) == 0)))) && (((byte)u._1052_1_ >> 5 & 1) == 0)) {
    pcVar10 = Monnam(local_168);
    pcVar12 = "floats";
    if ((local_168->data->mflags1 & 1) != 0) {
      pcVar12 = "flies";
    }
    pline("%s %s over the pit.",pcVar10,pcVar12);
  }
  return;
}

Assistant:

void digactualhole(int x, int y, struct monst *madeby, int ttyp)
{
	struct obj *oldobjs, *newobjs;
	struct trap *ttmp;
	char surface_type[BUFSZ];
	struct rm *loc = &level->locations[x][y];
	boolean shopdoor;
	struct monst *mtmp = m_at(level, x, y);	/* may be madeby */
	boolean madeby_u = (madeby == BY_YOU);
	boolean madeby_obj = (madeby == BY_OBJECT);
	boolean at_u = (x == u.ux) && (y == u.uy);
	boolean wont_fall = Levitation || Flying;

	if (u.utrap && u.utraptype == TT_INFLOOR) u.utrap = 0;

	/* these furniture checks were in dighole(), but wand
	   breaking bypasses that routine and calls us directly */
	if (IS_FOUNTAIN(loc->typ)) {
	    dogushforth(FALSE);
	    SET_FOUNTAIN_WARNED(x,y);		/* force dryup */
	    dryup(x, y, madeby_u);
	    return;
	} else if (IS_SINK(loc->typ)) {
	    breaksink(x, y);
	    return;
	} else if (loc->typ == DRAWBRIDGE_DOWN ||
		   (is_drawbridge_wall(x, y) >= 0)) {
	    int bx = x, by = y;
	    /* if under the portcullis, the bridge is adjacent */
	    find_drawbridge(&bx, &by);
	    destroy_drawbridge(bx, by);
	    return;
	}

	if (ttyp != PIT && !can_dig_down(level)) {
	    impossible("digactualhole: can't dig %s on this level.",
		       trapexplain[ttyp-1]);
	    ttyp = PIT;
	}

	/* maketrap(level, ) might change it, also, in this situation,
	   surface() returns an inappropriate string for a grave */
	if (IS_GRAVE(loc->typ))
	    strcpy(surface_type, "grave");
	else
	    strcpy(surface_type, surface(x,y));
	shopdoor = IS_DOOR(loc->typ) && *in_rooms(level, x, y, SHOPBASE);
	oldobjs = level->objects[x][y];
	ttmp = maketrap(level, x, y, ttyp);
	if (!ttmp) return;
	newobjs = level->objects[x][y];
	ttmp->tseen = (madeby_u || cansee(x,y));
	ttmp->madeby_u = madeby_u;
	newsym(ttmp->tx,ttmp->ty);

	if (ttyp == PIT) {

	    if (madeby_u) {
		pline("You dig a pit in the %s.", surface_type);
		if (shopdoor) pay_for_damage("ruin", FALSE);
	    } else if (!madeby_obj && canseemon(level, madeby))
		pline("%s digs a pit in the %s.", Monnam(madeby), surface_type);
	    else if (cansee(x, y) && flags.verbose)
		pline("A pit appears in the %s.", surface_type);

	    if (at_u) {
		if (!wont_fall) {
		    if (!Passes_walls)
			u.utrap = rn1(4,2);
		    u.utraptype = TT_PIT;
		    vision_full_recalc = 1;	/* vision limits change */
		} else
		    u.utrap = 0;
		if (oldobjs != newobjs)	/* something unearthed */
			pickup(1);	/* detects pit */
	    } else if (mtmp) {
		if (is_flyer(mtmp->data) || is_floater(mtmp->data)) {
		    if (canseemon(level, mtmp))
			pline("%s %s over the pit.", Monnam(mtmp),
						     (is_flyer(mtmp->data)) ?
						     "flies" : "floats");
		} else if (mtmp != madeby)
		    mintrap(mtmp);
	    }
	} else {	/* was TRAPDOOR now a HOLE*/

	    if (madeby_u)
		pline("You dig a hole through the %s.", surface_type);
	    else if (!madeby_obj && canseemon(level, madeby))
		pline("%s digs a hole through the %s.",
		      Monnam(madeby), surface_type);
	    else if (cansee(x, y) && flags.verbose)
		pline("A hole appears in the %s.", surface_type);

	    if (at_u) {
		if (!u.ustuck && !wont_fall && !next_to_u()) {
		    pline("You are jerked back by your pet!");
		    wont_fall = TRUE;
		}

		/* Floor objects get a chance of falling down.  The case where
		 * the hero does NOT fall down is treated here.  The case
		 * where the hero does fall down is treated in goto_level().
		 */
		if (u.ustuck || wont_fall) {
		    if (newobjs)
			impact_drop(NULL, x, y, 0);
		    if (oldobjs != newobjs)
			pickup(1);
		    if (shopdoor && madeby_u) pay_for_damage("ruin", FALSE);

		} else {
		    d_level newlevel;

		    if (*u.ushops && madeby_u)
			shopdig(1); /* shk might snatch pack */
		    /* handle earlier damage, eg breaking wand of digging */
		    else if (!madeby_u) pay_for_damage("dig into", TRUE);

		    pline("You fall through...");
		    /* Earlier checks must ensure that the destination
		     * level exists and is in the present dungeon.
		     */
		    newlevel.dnum = u.uz.dnum;
		    newlevel.dlevel = u.uz.dlevel + 1;
		    goto_level(&newlevel, FALSE, TRUE, FALSE);
		    /* messages for arriving in special rooms */
		    spoteffects(FALSE);
		}
	    } else {
		if (shopdoor && madeby_u) pay_for_damage("ruin", FALSE);
		if (newobjs)
		    impact_drop(NULL, x, y, 0);
		if (mtmp) {
		     /*[don't we need special sokoban handling here?]*/
		    if (is_flyer(mtmp->data) || is_floater(mtmp->data) ||
		        mtmp->data == &mons[PM_WUMPUS] ||
			(mtmp->wormno && count_wsegs(mtmp) > 5) ||
			mtmp->data->msize >= MZ_HUGE) return;
		    if (mtmp == u.ustuck)	/* probably a vortex */
			    return;		/* temporary? kludge */

		    if (teleport_pet(mtmp, FALSE)) {
			d_level tolevel;

			if (Is_stronghold(&u.uz)) {
			    assign_level(&tolevel, &valley_level);
			} else if (Is_botlevel(&u.uz)) {
			    if (canseemon(level, mtmp))
				pline("%s avoids the trap.", Monnam(mtmp));
			    return;
			} else {
			    get_level(&tolevel, depth(&u.uz) + 1);
			}
			if (mtmp->isshk) make_angry_shk(mtmp, 0, 0);
			migrate_to_level(mtmp, ledger_no(&tolevel),
					 MIGR_RANDOM, NULL);
		    }
		}
	    }
	}
}